

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImGui::GetColorU32(ImU32 col)

{
  ImU32 a;
  ImGuiStyle *style;
  ImU32 col_local;
  
  style._4_4_ = col;
  if ((GImGui->Style).Alpha < 1.0) {
    style._4_4_ = col & 0xffffff | (int)(long)((float)(col >> 0x18) * (GImGui->Style).Alpha) << 0x18
    ;
  }
  return style._4_4_;
}

Assistant:

ImU32 ImGui::GetColorU32(ImU32 col)
{
    ImGuiStyle& style = GImGui->Style;
    if (style.Alpha >= 1.0f)
        return col;
    ImU32 a = (col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT;
    a = (ImU32)(a * style.Alpha); // We don't need to clamp 0..255 because Style.Alpha is in 0..1 range.
    return (col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
}